

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O1

void __thiscall sensors_analytics::utils::ObjectNode::ObjectNode(ObjectNode *this)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_ObjectNode = (_func_int **)&PTR_SetList_00123d10;
  p_Var1 = &(this->properties_map_)._M_t._M_impl.super__Rb_tree_header;
  (this->properties_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->properties_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->properties_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->properties_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->properties_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

ObjectNode::ObjectNode() {}